

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

char * in_rooms(level *lev,xchar x,xchar y,int typewanted)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  undefined7 in_register_00000011;
  char cVar7;
  undefined7 in_register_00000031;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *local_68;
  
  uVar9 = *(uint *)&lev->locations[(int)CONCAT71(in_register_00000031,x)]
                    [(int)CONCAT71(in_register_00000011,y)].field_0x6;
  local_68 = in_rooms::buf + 4;
  uVar8 = uVar9 >> 0x10 & 0x3f;
  if (uVar8 != 0) {
    uVar2 = 2;
    if (uVar8 != 1) {
      if (uVar8 != 2) {
        if ((typewanted != 0) && (cVar7 = lev->rooms[uVar8 - 3].rtype, cVar7 != typewanted)) {
          if (typewanted != 0x12) {
            return in_rooms::buf + 4;
          }
          if (cVar7 < '\x13') {
            return in_rooms::buf + 4;
          }
        }
        in_rooms::buf[3] = (byte)(uVar9 >> 0x10) & 0x3f;
        return in_rooms::buf + 3;
      }
      uVar2 = 1;
    }
    uVar9 = 0;
    if (0x4f < (byte)x) {
      uVar9 = uVar2;
    }
    uVar8 = 0;
    if (x < '\x01') {
      uVar8 = uVar2;
    }
    iVar6 = x + -1 + uVar8;
    if (x < '\x01') {
      uVar9 = 0;
    }
    uVar8 = 0;
    if (y < '\x01') {
      uVar8 = uVar2;
    }
    uVar4 = 2 - uVar2;
    if (0xec < (byte)(y - 0x14U)) {
      uVar4 = 2;
    }
    lVar5 = (long)(int)((int)y + uVar8 + -1);
    bVar1 = (char)uVar2 * '\x02';
    local_68 = in_rooms::buf + 4;
    while( true ) {
      cVar7 = (char)iVar6;
      if ((int)(((int)x - uVar9) + 1) < (int)cVar7) break;
      uVar8 = *(uint *)&lev->locations[cVar7][lVar5].field_0x6;
      uVar10 = uVar8 >> 0x10 & 0x3f;
      if ((2 < uVar10) && (pcVar3 = strchr(local_68,uVar10), pcVar3 == (char *)0x0)) {
        if (typewanted != 0) {
          iVar6 = (int)lev->rooms[uVar10 - 3].rtype;
          if ((iVar6 != typewanted) && (typewanted != 0x12 || iVar6 < 0x13)) goto LAB_001a48d6;
        }
        local_68[-1] = (byte)(uVar8 >> 0x10) & 0x3f;
        local_68 = local_68 + -1;
      }
LAB_001a48d6:
      if (uVar2 <= uVar4) {
        uVar8 = *(uint *)&lev->locations[cVar7][lVar5 + (ulong)uVar2].field_0x6;
        uVar10 = uVar8 >> 0x10 & 0x3f;
        if ((2 < uVar10) && (pcVar3 = strchr(local_68,uVar10), pcVar3 == (char *)0x0)) {
          if (typewanted != 0) {
            iVar6 = (int)lev->rooms[uVar10 - 3].rtype;
            if ((iVar6 != typewanted) && (typewanted != 0x12 || iVar6 < 0x13)) goto LAB_001a4958;
          }
          local_68[-1] = (byte)(uVar8 >> 0x10) & 0x3f;
          local_68 = local_68 + -1;
        }
LAB_001a4958:
        if (bVar1 <= uVar4) {
          uVar8 = *(uint *)&lev->locations[cVar7][lVar5 + (ulong)bVar1].field_0x6;
          uVar10 = uVar8 >> 0x10 & 0x3f;
          if ((2 < uVar10) && (pcVar3 = strchr(local_68,uVar10), pcVar3 == (char *)0x0)) {
            if (typewanted != 0) {
              iVar6 = (int)lev->rooms[uVar10 - 3].rtype;
              if ((iVar6 != typewanted) && (typewanted != 0x12 || iVar6 < 0x13)) goto LAB_001a49d9;
            }
            local_68[-1] = (byte)(uVar8 >> 0x10) & 0x3f;
            local_68 = local_68 + -1;
          }
        }
      }
LAB_001a49d9:
      iVar6 = (int)cVar7 + uVar2;
    }
  }
  return local_68;
}

Assistant:

char *in_rooms(const struct level *lev, xchar x, xchar y, int typewanted)
{
	static char buf[5];
	char rno, *ptr = &buf[4];
	int typefound, min_x, min_y, max_x, max_y_offset, step;
	const struct rm *loc;

#define goodtype(rno) (!typewanted || \
	     ((typefound = lev->rooms[rno - ROOMOFFSET].rtype) == typewanted) || \
	     ((typewanted == SHOPBASE) && (typefound > SHOPBASE))) \

	switch (rno = lev->locations[x][y].roomno) {
		case NO_ROOM:
			return ptr;
		case SHARED:
			step = 2;
			break;
		case SHARED_PLUS:
			step = 1;
			break;
		default:			/* i.e. a regular room # */
			if (goodtype(rno))
				*(--ptr) = rno;
			return ptr;
	}

	min_x = x - 1;
	max_x = x + 1;
	if (x < 1)
		min_x += step;
	else
	if (x >= COLNO)
		max_x -= step;

	min_y = y - 1;
	max_y_offset = 2;
	if (min_y < 0) {
		min_y += step;
		max_y_offset -= step;
	} else
	if ((min_y + max_y_offset) >= ROWNO)
		max_y_offset -= step;

	for (x = min_x; x <= max_x; x += step) {
		loc = &lev->locations[x][min_y];
		y = 0;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
		y += step;
		if (y > max_y_offset)
			continue;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
		y += step;
		if (y > max_y_offset)
			continue;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
	}
	return ptr;
}